

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  IStreamingReporter *pIVar3;
  pointer pSVar4;
  pointer pSVar5;
  bool _missingAssertions;
  pointer this_00;
  Counts diff;
  Counts local_c8;
  SectionStats local_a8;
  
  local_c8.passed = (this->m_totals).assertions.passed - (endInfo->prevAssertions).passed;
  local_c8.failed = (this->m_totals).assertions.failed - (endInfo->prevAssertions).failed;
  local_c8.failedButOk =
       (this->m_totals).assertions.failedButOk - (endInfo->prevAssertions).failedButOk;
  _missingAssertions = testForMissingAssertions(this,&local_c8);
  ppIVar2 = (this->m_activeSections).
            super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_activeSections).
      super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppIVar2) {
    (*ppIVar2[-1]->_vptr_ITracker[8])();
    pppIVar1 = &(this->m_activeSections).
                super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + -1;
  }
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  SectionStats::SectionStats
            (&local_a8,&endInfo->sectionInfo,&local_c8,endInfo->durationInSeconds,_missingAssertions
            );
  (*pIVar3->_vptr_IStreamingReporter[0xb])(pIVar3,&local_a8);
  SectionStats::~SectionStats(&local_a8);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar4 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar5 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar4;
  if (pSVar5 != pSVar4) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar5);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar4;
  }
  return;
}

Assistant:

void RunContext::sectionEnded(SectionEndInfo const & endInfo) {
        Counts assertions = m_totals.assertions - endInfo.prevAssertions;
        bool missingAssertions = testForMissingAssertions(assertions);

        if (!m_activeSections.empty()) {
            m_activeSections.back()->close();
            m_activeSections.pop_back();
        }

        m_reporter->sectionEnded(SectionStats(endInfo.sectionInfo, assertions, endInfo.durationInSeconds, missingAssertions));
        m_messages.clear();
        m_messageScopes.clear();
    }